

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O0

void __thiscall MDPSolver::LoadQTables(MDPSolver *this,string *filename,int nrTables,QTables *Qs)

{
  PlanningUnitMADPDiscrete *in_RSI;
  MDPSolver *in_RDI;
  QTables *in_stack_00000430;
  size_t in_stack_00000438;
  size_t in_stack_00000440;
  size_t in_stack_00000448;
  string *in_stack_00000450;
  
  GetPU(in_RDI);
  PlanningUnitMADPDiscrete::GetNrStates(in_RSI);
  GetPU(in_RDI);
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x86f22d);
  QTable::Load(in_stack_00000450,in_stack_00000448,in_stack_00000440,in_stack_00000438,
               in_stack_00000430);
  return;
}

Assistant:

void MDPSolver::LoadQTables(const string &filename, int nrTables,
                            QTables &Qs)
{
    QTable::Load(filename,
                 GetPU()->GetNrStates(),
                 GetPU()->GetNrJointActions(),
                 nrTables,
                 Qs);
}